

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFraig.c
# Opt level: O0

void Abc_NtkFraigStoreCheck(Abc_Ntk_t *pFraig)

{
  int iVar1;
  int iVar2;
  Abc_Obj_t *pAVar3;
  Abc_Obj_t *pAVar4;
  int local_34;
  int local_30;
  int k;
  int i;
  int nStored;
  int nPoFinal;
  int nPoOrig;
  Abc_Obj_t *pNode1;
  Abc_Obj_t *pNode0;
  Abc_Ntk_t *pFraig_local;
  
  iVar1 = Abc_NtkPoNum(pFraig);
  iVar2 = Abc_FrameReadStoreSize();
  if (iVar1 % iVar2 == 0) {
    for (local_30 = 0; local_30 < iVar1 / iVar2; local_30 = local_30 + 1) {
      pAVar3 = Abc_NtkPo(pFraig,local_30);
      pAVar3 = Abc_ObjFanin0(pAVar3);
      for (local_34 = 1; local_34 < iVar2; local_34 = local_34 + 1) {
        pAVar4 = Abc_NtkPo(pFraig,local_34 * (iVar1 / iVar2) + local_30);
        pAVar4 = Abc_ObjFanin0(pAVar4);
        if (pAVar3 != pAVar4) {
          printf("Verification for PO #%d of network #%d has failed. The PO function is not used.\n"
                 ,(ulong)(local_30 + 1),(ulong)(local_34 + 1));
        }
      }
    }
    return;
  }
  __assert_fail("nPoFinal % nStored == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcFraig.c"
                ,0x31c,"void Abc_NtkFraigStoreCheck(Abc_Ntk_t *)");
}

Assistant:

void Abc_NtkFraigStoreCheck( Abc_Ntk_t * pFraig )
{
    Abc_Obj_t * pNode0, * pNode1;
    int nPoOrig, nPoFinal, nStored; 
    int i, k;
    // check that the PO functions are correct
    nPoFinal = Abc_NtkPoNum(pFraig);
    nStored  = Abc_FrameReadStoreSize();
    assert( nPoFinal % nStored == 0 );
    nPoOrig  = nPoFinal / nStored;
    for ( i = 0; i < nPoOrig; i++ )
    {
        pNode0 = Abc_ObjFanin0( Abc_NtkPo(pFraig, i) ); 
        for ( k = 1; k < nStored; k++ )
        {
            pNode1 = Abc_ObjFanin0( Abc_NtkPo(pFraig, k*nPoOrig+i) ); 
            if ( pNode0 != pNode1 )
                printf( "Verification for PO #%d of network #%d has failed. The PO function is not used.\n", i+1, k+1 );
        }
    }
}